

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O0

Debug * __thiscall Corrade::Utility::Debug::operator<<(Debug *this,char32_t *value)

{
  Debug *pDVar1;
  allocator<char32_t> local_39;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_38;
  char32_t *local_18;
  char32_t *value_local;
  Debug *this_local;
  
  local_18 = value;
  value_local = (char32_t *)this;
  std::allocator<char32_t>::allocator(&local_39);
  std::__cxx11::u32string::u32string((u32string *)&local_38,value,&local_39);
  pDVar1 = operator<<<char32_t,_0>(this,&local_38);
  std::__cxx11::u32string::~u32string((u32string *)&local_38);
  std::allocator<char32_t>::~allocator(&local_39);
  return pDVar1;
}

Assistant:

Debug& Debug::operator<<(const char32_t* value) {
    return *this << std::u32string(value);
}